

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ztrsv.c
# Opt level: O2

void ztrsv_(char *uplo,char *trans,char *diag,integer *n,doublecomplex *a,integer *lda,
           doublecomplex *x,integer *incx)

{
  long lVar1;
  double *pdVar2;
  char cVar3;
  byte bVar4;
  char cVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  doublecomplex *pdVar12;
  long lVar13;
  int iVar14;
  integer iVar15;
  ulong uVar16;
  doublecomplex *pdVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  int iVar25;
  ulong uVar26;
  uint *puVar27;
  double in_XMM0_Qa;
  double in_XMM0_Qb;
  double dVar28;
  double dVar29;
  doublecomplex local_c8;
  integer info;
  doublecomplex local_a8;
  doublecomplex local_98;
  ulong local_88;
  doublecomplex *local_80;
  double *local_78;
  uint *local_70;
  doublecomplex z__3;
  uint uVar24;
  
  info = 0;
  cVar3 = *uplo;
  if ((cVar3 == 'L') || (cVar3 == 'U')) {
    bVar4 = *trans;
    if ((bVar4 - 0x43 < 0x12) && ((0x20801U >> (bVar4 - 0x43 & 0x1f) & 1) != 0)) {
      cVar5 = *diag;
      if ((cVar5 == 'N') || (cVar5 == 'U')) {
        iVar18 = *n;
        uVar21 = (ulong)iVar18;
        if ((long)uVar21 < 0) {
          info = 4;
        }
        else if (*lda < (int)(iVar18 + (uint)(iVar18 == 0))) {
          info = 6;
        }
        else {
          iVar8 = *incx;
          if (iVar8 != 0) {
            if (iVar18 == 0) {
              return;
            }
            uVar20 = iVar18 - 1;
            iVar14 = iVar8 * uVar20;
            local_80 = (doublecomplex *)0x1;
            uVar26 = (ulong)(1 - iVar14);
            if (0 < iVar8) {
              uVar26 = 1;
            }
            iVar25 = (int)uVar26;
            local_70 = (uint *)n;
            if (bVar4 == 0x4e) {
              if (cVar3 != 'U') {
                if (iVar8 == 1) {
                  iVar18 = 0;
                  pdVar17 = x;
                  for (lVar10 = 1; pdVar17 = pdVar17 + 1, lVar10 <= (int)uVar21; lVar10 = lVar10 + 1
                      ) {
                    lVar13 = lVar10 + -1;
                    pdVar12 = x + lVar13;
                    dVar28 = x[lVar13].r;
                    if (((dVar28 != 0.0) || (NAN(dVar28))) ||
                       ((pdVar12->i != 0.0 || (NAN(pdVar12->i))))) {
                      if (cVar5 == 'N') {
                        z_div(&local_c8,pdVar12,a + (int)lVar13 * (*lda + 1));
                        pdVar12->r = local_c8.r;
                        pdVar12->i = local_c8.i;
                        uVar21 = (ulong)*local_70;
                        in_XMM0_Qa = local_98.r;
                        in_XMM0_Qb = local_98.i;
                        dVar28 = local_c8.r;
                        dVar29 = local_c8.i;
                      }
                      else {
                        dVar29 = pdVar12->i;
                      }
                      pdVar12 = pdVar17;
                      for (lVar13 = lVar10; local_98.r = in_XMM0_Qa, local_98.i = in_XMM0_Qb,
                          lVar13 < (int)uVar21; lVar13 = lVar13 + 1) {
                        dVar6 = a[(int)lVar13 + *lda * iVar18].r;
                        dVar7 = a[(int)lVar13 + *lda * iVar18].i;
                        in_XMM0_Qa = dVar6 * dVar28 + dVar7 * -dVar29;
                        in_XMM0_Qb = dVar7 * dVar28 + dVar6 * dVar29;
                        local_c8.r = pdVar12->r - in_XMM0_Qa;
                        local_c8.i = pdVar12->i - in_XMM0_Qb;
                        pdVar12->r = local_c8.r;
                        pdVar12->i = local_c8.i;
                        pdVar12 = pdVar12 + 1;
                      }
                    }
                    iVar18 = iVar18 + 1;
                  }
                  return;
                }
                for (lVar10 = 1; iVar18 = (int)lVar10, iVar18 <= (int)uVar21; lVar10 = lVar10 + 1) {
                  iVar14 = (int)uVar26;
                  dVar28 = x[(long)iVar14 + -1].r;
                  if ((((dVar28 != 0.0) || (NAN(dVar28))) || (x[(long)iVar14 + -1].i != 0.0)) ||
                     (NAN(x[(long)iVar14 + -1].i))) {
                    if (cVar5 == 'N') {
                      z_div(&local_c8,x + (long)iVar14 + -1,a + (*lda + 1) * (iVar18 + -1));
                      x[(long)iVar14 + -1].r = local_c8.r;
                      x[(long)iVar14 + -1].i = local_c8.i;
                      uVar21 = (ulong)*local_70;
                      in_XMM0_Qa = local_98.r;
                      in_XMM0_Qb = local_98.i;
                      dVar28 = local_c8.r;
                      dVar29 = local_c8.i;
                    }
                    else {
                      dVar29 = x[(long)iVar14 + -1].i;
                    }
                    for (lVar13 = lVar10; (int)lVar13 < (int)uVar21; lVar13 = lVar13 + 1) {
                      uVar26 = (long)(int)uVar26 + (long)*incx;
                      dVar6 = a[(long)*lda * (long)(iVar18 + -1) + lVar13].r;
                      dVar7 = a[(long)*lda * (long)(iVar18 + -1) + lVar13].i;
                      in_XMM0_Qa = dVar6 * dVar28 + dVar7 * -dVar29;
                      in_XMM0_Qb = dVar7 * dVar28 + dVar6 * dVar29;
                      local_c8.r = x[uVar26 - 1].r - in_XMM0_Qa;
                      local_c8.i = x[uVar26 - 1].i - in_XMM0_Qb;
                      x[uVar26 - 1].r = local_c8.r;
                      x[uVar26 - 1].i = local_c8.i;
                    }
                    iVar8 = *incx;
                    local_98.r = in_XMM0_Qa;
                    local_98.i = in_XMM0_Qb;
                  }
                  uVar26 = (ulong)(uint)(iVar14 + iVar8);
                }
                return;
              }
              if (iVar8 == 1) {
                iVar18 = iVar18 + -2;
                while (0 < (int)uVar21) {
                  uVar21 = uVar21 - 1;
                  pdVar17 = x + (uVar21 & 0xffffffff);
                  dVar28 = x[uVar21 & 0xffffffff].r;
                  if ((((dVar28 != 0.0) || (NAN(dVar28))) || (pdVar17->i != 0.0)) ||
                     (NAN(pdVar17->i))) {
                    if (cVar5 == 'N') {
                      z_div(&local_c8,pdVar17,a + (*lda + 1) * (int)uVar21);
                      pdVar17->r = local_c8.r;
                      pdVar17->i = local_c8.i;
                      in_XMM0_Qa = local_98.r;
                      in_XMM0_Qb = local_98.i;
                      dVar28 = local_c8.r;
                      dVar29 = local_c8.i;
                    }
                    else {
                      dVar29 = pdVar17->i;
                    }
                    iVar8 = iVar18;
                    uVar24 = uVar20;
                    while (local_98.r = in_XMM0_Qa, local_98.i = in_XMM0_Qb, 0 < (int)uVar24) {
                      uVar24 = uVar24 - 1;
                      dVar6 = a[(int)(*lda * uVar20 + iVar8)].r;
                      dVar7 = a[(int)(*lda * uVar20 + iVar8)].i;
                      in_XMM0_Qa = dVar6 * dVar28 + dVar7 * -dVar29;
                      in_XMM0_Qb = dVar7 * dVar28 + dVar6 * dVar29;
                      local_c8.r = x[uVar24].r - in_XMM0_Qa;
                      local_c8.i = x[uVar24].i - in_XMM0_Qb;
                      x[uVar24].r = local_c8.r;
                      x[uVar24].i = local_c8.i;
                      iVar8 = iVar8 + -1;
                    }
                  }
                  uVar20 = uVar20 - 1;
                  iVar18 = iVar18 + -1;
                }
                return;
              }
              uVar20 = iVar25 + iVar14;
              while (iVar18 = (int)uVar21, 0 < iVar18) {
                dVar28 = x[(long)(int)uVar20 + -1].r;
                if (((dVar28 != 0.0) || (NAN(dVar28))) ||
                   ((x[(long)(int)uVar20 + -1].i != 0.0 || (NAN(x[(long)(int)uVar20 + -1].i))))) {
                  if (cVar5 == 'N') {
                    local_78 = (double *)CONCAT44(local_78._4_4_,uVar20);
                    z_div(&local_c8,x + (long)(int)uVar20 + -1,a + (*lda + 1) * (iVar18 + -1));
                    x[(long)(int)uVar20 + -1].r = local_c8.r;
                    x[(long)(int)uVar20 + -1].i = local_c8.i;
                    in_XMM0_Qa = local_98.r;
                    in_XMM0_Qb = local_98.i;
                    dVar28 = local_c8.r;
                    dVar29 = local_c8.i;
                    uVar20 = (uint)local_78;
                  }
                  else {
                    dVar29 = x[(long)(int)uVar20 + -1].i;
                  }
                  lVar10 = (long)(iVar18 + -2);
                  uVar16 = (ulong)uVar20;
                  uVar21 = (ulong)(iVar18 - 1U);
                  for (uVar26 = uVar21; 0 < (int)uVar26; uVar26 = (ulong)((int)uVar26 - 1)) {
                    uVar16 = (long)(int)uVar16 - (long)*incx;
                    dVar6 = a[(long)*lda * (long)(int)(iVar18 - 1U) + lVar10].r;
                    dVar7 = a[(long)*lda * (long)(int)(iVar18 - 1U) + lVar10].i;
                    in_XMM0_Qa = dVar6 * dVar28 + dVar7 * -dVar29;
                    in_XMM0_Qb = dVar7 * dVar28 + dVar6 * dVar29;
                    local_c8.r = x[uVar16 - 1].r - in_XMM0_Qa;
                    local_c8.i = x[uVar16 - 1].i - in_XMM0_Qb;
                    x[uVar16 - 1].r = local_c8.r;
                    x[uVar16 - 1].i = local_c8.i;
                    lVar10 = lVar10 + -1;
                  }
                  iVar8 = *incx;
                  local_98.r = in_XMM0_Qa;
                  local_98.i = in_XMM0_Qb;
                }
                else {
                  uVar21 = (ulong)(iVar18 - 1);
                }
                uVar20 = uVar20 - iVar8;
              }
              return;
            }
            if (cVar3 != 'U') {
              if (iVar8 != 1) {
                iVar25 = iVar25 + iVar14;
                pdVar17 = x + -1;
                local_78 = (double *)CONCAT44(local_78._4_4_,iVar25);
                iVar18 = iVar25;
                local_80 = pdVar17;
                do {
                  iVar14 = (int)uVar21;
                  if (iVar14 < 1) {
                    return;
                  }
                  local_88 = CONCAT44(local_88._4_4_,iVar14 + -1);
                  local_a8.r = pdVar17[iVar18].r;
                  local_a8.i = pdVar17[iVar18].i;
                  iVar15 = *local_70;
                  iVar22 = iVar25;
                  if (bVar4 == 0x54) {
                    for (; iVar14 < iVar15; iVar15 = iVar15 + -1) {
                      iVar19 = *lda * uVar20 + iVar15 + -1;
                      dVar28 = pdVar17[iVar22].r;
                      dVar29 = pdVar17[iVar22].i;
                      local_98.r = a[iVar19].r * dVar28 + dVar29 * -a[iVar19].i;
                      local_98.i = a[iVar19].r * dVar29 + dVar28 * a[iVar19].i;
                      local_a8.r = local_a8.r - local_98.r;
                      local_a8.i = local_a8.i - local_98.i;
                      iVar22 = iVar22 - iVar8;
                      local_c8.r = local_a8.r;
                      local_c8.i = local_a8.i;
                    }
                    if (cVar5 == 'N') {
                      pdVar12 = a + (*lda + 1) * (iVar14 + -1);
LAB_0011262a:
                      z_div(&local_c8,&local_a8,pdVar12);
                      local_a8.r = local_c8.r;
                      local_a8.i = local_c8.i;
                    }
                  }
                  else {
                    for (; pdVar17 = local_80, iVar14 < iVar15; iVar15 = iVar15 + -1) {
                      d_cnjg(&z__3,a + (int)(*lda * uVar20 + iVar15 + -1));
                      dVar28 = local_80[iVar25].r;
                      dVar29 = local_80[iVar25].i;
                      local_98.r = z__3.r * dVar28 + dVar29 * -z__3.i;
                      local_98.i = z__3.r * dVar29 + dVar28 * z__3.i;
                      local_a8.r = local_a8.r - local_98.r;
                      local_a8.i = local_a8.i - local_98.i;
                      iVar25 = iVar25 - *incx;
                      local_c8.r = local_a8.r;
                      local_c8.i = local_a8.i;
                    }
                    iVar25 = (uint)local_78;
                    if (cVar5 == 'N') {
                      pdVar12 = &local_98;
                      d_cnjg(pdVar12,a + (*lda + 1) * (int)local_88);
                      goto LAB_0011262a;
                    }
                  }
                  pdVar17[iVar18].r = local_a8.r;
                  pdVar17[iVar18].i = local_a8.i;
                  iVar8 = *incx;
                  iVar18 = iVar18 - iVar8;
                  uVar20 = uVar20 - 1;
                  uVar21 = local_88 & 0xffffffff;
                } while( true );
              }
              do {
                iVar18 = (int)uVar21;
                if (iVar18 < 1) {
                  return;
                }
                uVar21 = uVar21 - 1;
                local_80 = (doublecomplex *)((uVar21 & 0xffffffff) * 0x10);
                local_a8.r = x[uVar21 & 0xffffffff].r;
                local_a8.i = x[uVar21 & 0xffffffff].i;
                uVar24 = *local_70;
                if (bVar4 == 0x54) {
                  while (uVar23 = uVar24 - 1, iVar18 < (int)uVar24) {
                    iVar8 = *lda * uVar20 + uVar23;
                    dVar28 = x[uVar23].r;
                    dVar29 = x[uVar23].i;
                    local_98.r = a[iVar8].r * dVar28 + dVar29 * -a[iVar8].i;
                    local_98.i = a[iVar8].r * dVar29 + dVar28 * a[iVar8].i;
                    local_a8.r = local_a8.r - local_98.r;
                    local_a8.i = local_a8.i - local_98.i;
                    uVar24 = uVar23;
                    local_c8.r = local_a8.r;
                    local_c8.i = local_a8.i;
                  }
                  if (cVar5 == 'N') {
                    pdVar17 = a + (*lda + 1) * (int)uVar21;
LAB_00111eeb:
                    z_div(&local_c8,&local_a8,pdVar17);
                    local_a8.r = local_c8.r;
                    local_a8.i = local_c8.i;
                  }
                }
                else {
                  while (uVar23 = uVar24 - 1, iVar18 < (int)uVar24) {
                    d_cnjg(&z__3,a + (int)(*lda * uVar20 + uVar23));
                    dVar28 = x[uVar23].r;
                    dVar29 = x[uVar23].i;
                    local_98.r = z__3.r * dVar28 + dVar29 * -z__3.i;
                    local_98.i = z__3.r * dVar29 + dVar28 * z__3.i;
                    local_a8.r = local_a8.r - local_98.r;
                    local_a8.i = local_a8.i - local_98.i;
                    uVar24 = uVar23;
                    local_c8.r = local_a8.r;
                    local_c8.i = local_a8.i;
                  }
                  if (cVar5 == 'N') {
                    pdVar17 = &local_98;
                    d_cnjg(pdVar17,a + (*lda + 1) * (int)uVar21);
                    goto LAB_00111eeb;
                  }
                }
                pdVar9 = (double *)((long)&x->r + (long)local_80);
                *pdVar9 = local_a8.r;
                pdVar9[1] = local_a8.i;
                uVar20 = uVar20 - 1;
              } while( true );
            }
            if (iVar8 != 1) {
              iVar18 = 0;
              local_78 = (double *)CONCAT44(local_78._4_4_,iVar25);
              uVar16 = uVar26;
              do {
                if ((int)uVar21 < (int)local_80) {
                  return;
                }
                iVar14 = (int)uVar26;
                iVar22 = (int)local_80 + -1;
                local_a8.r = x[(long)iVar14 + -1].r;
                local_a8.i = x[(long)iVar14 + -1].i;
                local_88 = CONCAT44(local_88._4_4_,iVar14);
                if (bVar4 == 0x54) {
                  pdVar17 = x + (long)iVar25 + -1;
                  for (lVar10 = 0; iVar18 != (int)lVar10; lVar10 = lVar10 + 1) {
                    lVar13 = (long)*lda * (long)iVar18 + lVar10;
                    local_98.r = a[lVar13].r * pdVar17->r + pdVar17->i * -a[lVar13].i;
                    local_98.i = a[lVar13].r * pdVar17->i + pdVar17->r * a[lVar13].i;
                    local_a8.r = local_a8.r - local_98.r;
                    local_a8.i = local_a8.i - local_98.i;
                    pdVar17 = pdVar17 + iVar8;
                    local_c8.r = local_a8.r;
                    local_c8.i = local_a8.i;
                  }
                  puVar27 = local_70;
                  if (cVar5 == 'N') {
                    pdVar17 = a + (*lda + 1) * iVar22;
LAB_0011227f:
                    z_div(&local_c8,&local_a8,pdVar17);
                    local_a8.r = local_c8.r;
                    local_a8.i = local_c8.i;
                  }
                }
                else {
                  for (lVar10 = 0; puVar27 = local_70, iVar18 != (int)lVar10; lVar10 = lVar10 + 1) {
                    d_cnjg(&z__3,a + (long)*lda * (long)iVar18 + lVar10);
                    dVar28 = x[(long)(int)uVar16 + -1].r;
                    dVar29 = x[(long)(int)uVar16 + -1].i;
                    local_98.r = z__3.r * dVar28 + dVar29 * -z__3.i;
                    local_98.i = z__3.r * dVar29 + dVar28 * z__3.i;
                    local_a8.r = local_a8.r - local_98.r;
                    local_a8.i = local_a8.i - local_98.i;
                    uVar16 = (ulong)(uint)((int)uVar16 + *incx);
                    local_c8.r = local_a8.r;
                    local_c8.i = local_a8.i;
                  }
                  if (cVar5 == 'N') {
                    pdVar17 = &local_98;
                    d_cnjg(pdVar17,a + (*lda + 1) * iVar22);
                    goto LAB_0011227f;
                  }
                }
                x[(long)iVar14 + -1].r = local_a8.r;
                x[(long)iVar14 + -1].i = local_a8.i;
                iVar8 = *incx;
                uVar26 = (ulong)(uint)((int)local_88 + iVar8);
                local_80 = (doublecomplex *)(ulong)((int)local_80 + 1);
                uVar21 = (ulong)*puVar27;
                iVar18 = iVar18 + 1;
                uVar16 = (ulong)local_78 & 0xffffffff;
              } while( true );
            }
            local_78 = &a->i;
            local_80 = (doublecomplex *)0x1;
            lVar13 = 0;
            lVar10 = 0;
            do {
              if ((long)(int)uVar21 < (long)local_80) {
                return;
              }
              lVar1 = (long)local_80 + -1;
              local_a8.r = x[lVar1].r;
              local_a8.i = x[lVar1].i;
              local_88 = lVar1;
              if (bVar4 == 0x54) {
                pdVar9 = local_78;
                for (lVar11 = 8; lVar11 + lVar13 != 8; lVar11 = lVar11 + 0x10) {
                  dVar28 = *(double *)((long)pdVar9 + *lda * lVar10 + -8);
                  dVar29 = *(double *)((long)pdVar9 + *lda * lVar10);
                  pdVar2 = (double *)((long)x + lVar11 + -8);
                  dVar6 = *pdVar2;
                  dVar7 = pdVar2[1];
                  local_98.r = dVar28 * dVar6 + dVar7 * -dVar29;
                  local_98.i = dVar28 * dVar7 + dVar6 * dVar29;
                  local_a8.r = local_a8.r - local_98.r;
                  local_a8.i = local_a8.i - local_98.i;
                  pdVar9 = pdVar9 + 2;
                  local_c8.r = local_a8.r;
                  local_c8.i = local_a8.i;
                }
                if (cVar5 == 'N') {
                  pdVar17 = a + (int)lVar1 * (*lda + 1);
LAB_00111bbc:
                  z_div(&local_c8,&local_a8,pdVar17);
                  local_a8.r = local_c8.r;
                  local_a8.i = local_c8.i;
                }
              }
              else {
                for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 0x10) {
                  d_cnjg(&z__3,(doublecomplex *)((long)&a->r + lVar11 + *lda * lVar10));
                  pdVar9 = (double *)((long)&x->r + lVar11);
                  dVar28 = *pdVar9;
                  dVar29 = pdVar9[1];
                  local_98.r = z__3.r * dVar28 + dVar29 * -z__3.i;
                  local_98.i = z__3.r * dVar29 + dVar28 * z__3.i;
                  local_a8.r = local_a8.r - local_98.r;
                  local_a8.i = local_a8.i - local_98.i;
                  local_c8.r = local_a8.r;
                  local_c8.i = local_a8.i;
                }
                if (cVar5 == 'N') {
                  pdVar17 = &local_98;
                  d_cnjg(pdVar17,a + (int)local_88 * (*lda + 1));
                  goto LAB_00111bbc;
                }
              }
              x[lVar1].r = local_a8.r;
              x[lVar1].i = local_a8.i;
              local_80 = (doublecomplex *)((long)local_80 + 1);
              uVar21 = (ulong)*local_70;
              lVar10 = lVar10 + 0x10;
              lVar13 = lVar13 + -0x10;
            } while( true );
          }
          info = 8;
        }
      }
      else {
        info = 3;
      }
    }
    else {
      info = 2;
    }
  }
  else {
    info = 1;
  }
  input_error("ZTRSV ",&info);
  return;
}

Assistant:

void ztrsv_(char *uplo, char *trans, char *diag, integer *n, 
	doublecomplex *a, integer *lda, doublecomplex *x, integer *incx)
{

    /* System generated locals */

    doublecomplex z__1, z__2, z__3;

    /* Builtin functions */
    void z_div(doublecomplex *, doublecomplex *, doublecomplex *), d_cnjg(
	    doublecomplex *, doublecomplex *);

    /* Local variables */
    integer info;
    doublecomplex temp;
    integer i, j;
    integer ix, jx, kx;
    logical noconj, nounit;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    ZTRSV  solves one of the systems of equations   

       A*x = b,   or   A'*x = b,   or   conjg( A' )*x = b,   

    where b and x are n element vectors and A is an n by n unit, or   
    non-unit, upper or lower triangular matrix.   

    No test for singularity or near-singularity is included in this   
    routine. Such tests must be performed before calling this routine.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the matrix is an upper or   
             lower triangular matrix as follows:   

                UPLO = 'U' or 'u'   A is an upper triangular matrix.   

                UPLO = 'L' or 'l'   A is a lower triangular matrix.   

             Unchanged on exit.   

    TRANS  - CHARACTER*1.   
             On entry, TRANS specifies the equations to be solved as   
             follows:   

                TRANS = 'N' or 'n'   A*x = b.   

                TRANS = 'T' or 't'   A'*x = b.   

                TRANS = 'C' or 'c'   conjg( A' )*x = b.   

             Unchanged on exit.   

    DIAG   - CHARACTER*1.   
             On entry, DIAG specifies whether or not A is unit   
             triangular as follows:   

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.   

                DIAG = 'N' or 'n'   A is not assumed to be unit   
                                    triangular.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    A      - COMPLEX*16       array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular matrix and the strictly lower triangular part of 
  
             A is not referenced.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular matrix and the strictly upper triangular part of 
  
             A is not referenced.   
             Note that when  DIAG = 'U' or 'u', the diagonal elements of 
  
             A are not referenced either, but are assumed to be unity.   
             Unchanged on exit.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   

    X      - COMPLEX*16       array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element right-hand side vector b. On exit, X is overwritten 
  
             with the solution vector x.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   



       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 &&
		strncmp(trans, "C", 1)!=0 ) {
	info = 2;
    } else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 ) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,*n)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    }
    if (info != 0) {
	input_error("ZTRSV ", &info);
	return;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return;
    }

    noconj = (strncmp(trans, "T", 1)==0);
    nounit = (strncmp(diag, "N", 1)==0);

/*     Set up the start point in X if the increment is not unity. This   
       will be  ( N - 1 )*INCX  too small for descending loops. */

    if (*incx <= 0) {
	kx = 1 - (*n - 1) * *incx;
    } else if (*incx != 1) {
	kx = 1;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */

    if (strncmp(trans, "N", 1)==0) {

/*        Form  x := inv( A )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    if (X(j).r != 0. || X(j).i != 0.) {
			if (nounit) {
			    z_div(&z__1, &X(j), &A(j,j));
			    X(j).r = z__1.r, X(j).i = z__1.i;
			}
			temp.r = X(j).r, temp.i = X(j).i;
			for (i = j - 1; i >= 1; --i) {
			    z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    z__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    z__1.r = X(i).r - z__2.r, z__1.i = X(i).i - 
				    z__2.i;
			    X(i).r = z__1.r, X(i).i = z__1.i;
/* L10: */
			}
		    }
/* L20: */
		}
	    } else {
		jx = kx + (*n - 1) * *incx;
		for (j = *n; j >= 1; --j) {
		    if (X(jx).r != 0. || X(jx).i != 0.) {
			if (nounit) {
			    z_div(&z__1, &X(jx), &A(j,j));
			    X(jx).r = z__1.r, X(jx).i = z__1.i;
			}
			temp.r = X(jx).r, temp.i = X(jx).i;
			ix = jx;
			for (i = j - 1; i >= 1; --i) {
			    ix -= *incx;
			    z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    z__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    z__1.r = X(ix).r - z__2.r, z__1.i = X(ix).i - 
				    z__2.i;
			    X(ix).r = z__1.r, X(ix).i = z__1.i;
/* L30: */
			}
		    }
		    jx -= *incx;
/* L40: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    if (X(j).r != 0. || X(j).i != 0.) {
			if (nounit) {
			    z_div(&z__1, &X(j), &A(j,j));
			    X(j).r = z__1.r, X(j).i = z__1.i;
			}
			temp.r = X(j).r, temp.i = X(j).i;
			for (i = j + 1; i <= *n; ++i) {
			    z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    z__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    z__1.r = X(i).r - z__2.r, z__1.i = X(i).i - 
				    z__2.i;
			    X(i).r = z__1.r, X(i).i = z__1.i;
/* L50: */
			}
		    }
/* L60: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    if (X(jx).r != 0. || X(jx).i != 0.) {
			if (nounit) {
			    z_div(&z__1, &X(jx), &A(j,j));
			    X(jx).r = z__1.r, X(jx).i = z__1.i;
			}
			temp.r = X(jx).r, temp.i = X(jx).i;
			ix = jx;
			for (i = j + 1; i <= *n; ++i) {
			    ix += *incx;
			    z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    z__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    z__1.r = X(ix).r - z__2.r, z__1.i = X(ix).i - 
				    z__2.i;
			    X(ix).r = z__1.r, X(ix).i = z__1.i;
/* L70: */
			}
		    }
		    jx += *incx;
/* L80: */
		}
	    }
	}
    } else {

/*        Form  x := inv( A' )*x  or  x := inv( conjg( A' ) )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    temp.r = X(j).r, temp.i = X(j).i;
		    if (noconj) {
			for (i = 1; i <= j-1; ++i) {
			    z__2.r = A(i,j).r * X(i).r - A(i,j).i * X(
				    i).i, z__2.i = A(i,j).r * X(i).i + 
				    A(i,j).i * X(i).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
/* L90: */
			}
			if (nounit) {
			    z_div(&z__1, &temp, &A(j,j));
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    } else {
			for (i = 1; i <= j-1; ++i) {
			    d_cnjg(&z__3, &A(i,j));
			    z__2.r = z__3.r * X(i).r - z__3.i * X(i).i, 
				    z__2.i = z__3.r * X(i).i + z__3.i * X(
				    i).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
/* L100: */
			}
			if (nounit) {
			    d_cnjg(&z__2, &A(j,j));
			    z_div(&z__1, &temp, &z__2);
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    }
		    X(j).r = temp.r, X(j).i = temp.i;
/* L110: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    ix = kx;
		    temp.r = X(jx).r, temp.i = X(jx).i;
		    if (noconj) {
			for (i = 1; i <= j-1; ++i) {
			    z__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(
				    ix).i, z__2.i = A(i,j).r * X(ix).i + 
				    A(i,j).i * X(ix).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
			    ix += *incx;
/* L120: */
			}
			if (nounit) {
			    z_div(&z__1, &temp, &A(j,j));
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    } else {
			for (i = 1; i <= j-1; ++i) {
			    d_cnjg(&z__3, &A(i,j));
			    z__2.r = z__3.r * X(ix).r - z__3.i * X(ix).i, 
				    z__2.i = z__3.r * X(ix).i + z__3.i * X(
				    ix).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
			    ix += *incx;
/* L130: */
			}
			if (nounit) {
			    d_cnjg(&z__2, &A(j,j));
			    z_div(&z__1, &temp, &z__2);
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    }
		    X(jx).r = temp.r, X(jx).i = temp.i;
		    jx += *incx;
/* L140: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    temp.r = X(j).r, temp.i = X(j).i;
		    if (noconj) {
			for (i = *n; i >= j+1; --i) {
			    z__2.r = A(i,j).r * X(i).r - A(i,j).i * X(
				    i).i, z__2.i = A(i,j).r * X(i).i + 
				    A(i,j).i * X(i).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
/* L150: */
			}
			if (nounit) {
			    z_div(&z__1, &temp, &A(j,j));
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    } else {
			for (i = *n; i >= j+1; --i) {
			    d_cnjg(&z__3, &A(i,j));
			    z__2.r = z__3.r * X(i).r - z__3.i * X(i).i, 
				    z__2.i = z__3.r * X(i).i + z__3.i * X(
				    i).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
/* L160: */
			}
			if (nounit) {
			    d_cnjg(&z__2, &A(j,j));
			    z_div(&z__1, &temp, &z__2);
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    }
		    X(j).r = temp.r, X(j).i = temp.i;
/* L170: */
		}
	    } else {
		kx += (*n - 1) * *incx;
		jx = kx;
		for (j = *n; j >= 1; --j) {
		    ix = kx;
		    temp.r = X(jx).r, temp.i = X(jx).i;
		    if (noconj) {
			for (i = *n; i >= j+1; --i) {
			    z__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(
				    ix).i, z__2.i = A(i,j).r * X(ix).i + 
				    A(i,j).i * X(ix).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
			    ix -= *incx;
/* L180: */
			}
			if (nounit) {
			    z_div(&z__1, &temp, &A(j,j));
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    } else {
			for (i = *n; i >= j+1; --i) {
			    d_cnjg(&z__3, &A(i,j));
			    z__2.r = z__3.r * X(ix).r - z__3.i * X(ix).i, 
				    z__2.i = z__3.r * X(ix).i + z__3.i * X(
				    ix).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
			    ix -= *incx;
/* L190: */
			}
			if (nounit) {
			    d_cnjg(&z__2, &A(j,j));
			    z_div(&z__1, &temp, &z__2);
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    }
		    X(jx).r = temp.r, X(jx).i = temp.i;
		    jx -= *incx;
/* L200: */
		}
	    }
	}
    }

    return;

/*     End of ZTRSV . */

}